

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmInstallTargetGenerator::AddRPathCheckRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *config,
          string *toDestDirPath)

{
  cmMakefile *this_00;
  bool bVar1;
  cmComputeLinkInformation *this_01;
  ostream *poVar2;
  Indent IVar3;
  string newRpath;
  string local_50;
  
  if ((this->ImportLibrary == false) &&
     (bVar1 = cmGeneratorTarget::IsChrpathUsed(this->Target,config), bVar1)) {
    this_00 = this->Target->Target->Makefile;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"CMAKE_PLATFORM_HAS_INSTALLNAME","");
    bVar1 = cmMakefile::IsOn(this_00,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((!bVar1) &&
       (this_01 = cmGeneratorTarget::GetLinkInformation(this->Target,config),
       this_01 != (cmComputeLinkInformation *)0x0)) {
      cmComputeLinkInformation::GetChrpathString_abi_cxx11_(&local_50,this_01);
      IVar3.Level = indent.Level;
      if (0 < indent.Level) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          IVar3.Level = IVar3.Level + -1;
        } while (IVar3.Level != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"file(RPATH_CHECK\n",0x11);
      IVar3.Level = indent.Level;
      if (0 < indent.Level) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          IVar3.Level = IVar3.Level + -1;
        } while (IVar3.Level != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"     FILE \"",0xb);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(toDestDirPath->_M_dataplus)._M_p,toDestDirPath->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"\n",2);
      if (0 < indent.Level) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
          indent.Level = indent.Level + -1;
        } while (indent.Level != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"     RPATH \"",0xc);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_50._M_dataplus._M_p,local_50._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\")\n",3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddRPathCheckRule(
  std::ostream& os, Indent indent, const std::string& config,
  std::string const& toDestDirPath)
{
  // Skip the chrpath if the target does not need it.
  if (this->ImportLibrary || !this->Target->IsChrpathUsed(config)) {
    return;
  }
  // Skip if on Apple
  if (this->Target->Target->GetMakefile()->IsOn(
        "CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    return;
  }

  // Get the link information for this target.
  // It can provide the RPATH.
  cmComputeLinkInformation* cli = this->Target->GetLinkInformation(config);
  if (!cli) {
    return;
  }

  // Get the install RPATH from the link information.
  std::string newRpath = cli->GetChrpathString();

  // Write a rule to remove the installed file if its rpath is not the
  // new rpath.  This is needed for existing build/install trees when
  // the installed rpath changes but the file is not rebuilt.
  /* clang-format off */
  os << indent << "file(RPATH_CHECK\n"
     << indent << "     FILE \"" << toDestDirPath << "\"\n"
     << indent << "     RPATH \"" << newRpath << "\")\n";
  /* clang-format on */
}